

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O2

void __thiscall
Math_DifferenceOfProducts_Test::Math_DifferenceOfProducts_Test(Math_DifferenceOfProducts_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0313d468;
  return;
}

Assistant:

TEST(Math, DifferenceOfProducts) {
    for (int i = 0; i < 100000; ++i) {
        RNG rng(i);
        auto r = [&rng]() {
            Float logu = Lerp(rng.Uniform<Float>(), -8, 8);
            return std::pow(10, logu);
        };
        Float a = r(), b = r(), c = r(), d = r();
        Float sign = rng.Uniform<Float>() < -0.5 ? -1 : 1;
        b *= sign;
        c *= sign;
        Float dp = DifferenceOfProducts(a, b, c, d);
        Float dp2 = FMA(double(a), double(b), -double(c) * double(d));
        Float err = std::abs(dp - dp2);
        Float ulp = NextFloatUp(std::abs(dp2)) - std::abs(dp2);
        EXPECT_LT(err, 2 * ulp);
    }
}